

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O3

void __thiscall SRBRoot::compactStringsV2(SRBRoot *this,UHashtable *stringSet,UErrorCode *errorCode)

{
  ushort uVar1;
  long lVar2;
  StringResource *pSVar3;
  SRBRoot *pSVar4;
  SResource *pSVar5;
  byte bVar6;
  UBool UVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  void *array;
  UHashElement *pUVar11;
  StringBaseResource *this_00;
  short sVar12;
  int32_t iVar13;
  ulong uVar14;
  UChar *srcChars;
  long *plVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int32_t pos;
  ulong local_50;
  int32_t local_34;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar8 = uhash_count_63(stringSet);
  uVar14 = (ulong)(int)uVar8;
  uVar20 = 0xffffffffffffffff;
  if (-1 < (int)uVar8) {
    uVar20 = uVar14 * 8;
  }
  array = operator_new__(uVar20);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_34 = -1;
    if (0 < (int)uVar8) {
      uVar20 = 0;
      do {
        pUVar11 = uhash_nextElement_63(stringSet,&local_34);
        *(UHashTok *)((long)array + uVar20 * 8) = pUVar11->key;
        uVar20 = uVar20 + 1;
      } while (uVar8 != uVar20);
    }
    uprv_sortArray_63(array,uVar8,8,compareStringSuffixes,(void *)0x0,'\0',errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (0 < (int)uVar8) {
        iVar9 = 0;
        do {
          lVar19 = (long)iVar9;
          lVar2 = *(long *)((long)array + lVar19 * 8);
          if (*(short *)(lVar2 + 0x40) < 0) {
            iVar18 = *(int *)(lVar2 + 0x44);
          }
          else {
            iVar18 = (int)*(short *)(lVar2 + 0x40) >> 5;
          }
          *(int *)(lVar2 + 0x88) =
               (*(int *)(lVar2 + 0x84) + -1) * (iVar18 + *(char *)(lVar2 + 0x8c) + 1);
          iVar9 = iVar9 + 1;
          if (iVar9 < (int)uVar8) {
            uVar20 = lVar19 + 1;
            while( true ) {
              lVar19 = *(long *)((long)array + uVar20 * 8);
              sVar12 = *(short *)(lVar2 + 0x40);
              uVar1 = *(ushort *)(lVar19 + 0x40);
              if ((uVar1 & 1) == 0) {
                if ((short)uVar1 < 0) {
                  iVar9 = *(int *)(lVar19 + 0x44);
                }
                else {
                  iVar9 = (int)(short)uVar1 >> 5;
                }
                iVar18 = 0;
                if (iVar9 < 0) {
                  iVar18 = iVar9;
                }
                iVar17 = iVar9 - iVar18;
                if (iVar9 <= iVar9 - iVar18) {
                  iVar17 = iVar9;
                }
                if (iVar9 < 0) {
                  iVar17 = 0;
                }
                if (sVar12 < 0) {
                  iVar10 = *(int *)(lVar2 + 0x44);
                }
                else {
                  iVar10 = (int)sVar12 >> 5;
                }
                if ((uVar1 & 2) == 0) {
                  srcChars = *(UChar **)(lVar19 + 0x50);
                }
                else {
                  srcChars = (UChar *)(lVar19 + 0x42);
                }
                bVar6 = icu_63::UnicodeString::doCompare
                                  ((UnicodeString *)(lVar2 + 0x38),iVar10 - iVar9,iVar9,srcChars,
                                   iVar18,iVar17);
              }
              else {
                bVar6 = ~(byte)sVar12 & 1;
              }
              if (bVar6 != 0) break;
              if (*(short *)(lVar2 + 0x40) < 0) {
                iVar9 = *(int *)(lVar2 + 0x44);
              }
              else {
                iVar9 = (int)*(short *)(lVar2 + 0x40) >> 5;
              }
              sVar12 = *(short *)(lVar19 + 0x40);
              iVar10 = (int)sVar12 >> 5;
              iVar18 = *(int *)(lVar19 + 0x44);
              iVar17 = iVar10;
              if (sVar12 < 0) {
                iVar17 = iVar18;
              }
              if (iVar9 == iVar17) {
                __assert_fail("res->length() != suffixRes->length()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                              ,0x621,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
              }
              if ((*(char *)(lVar19 + 9) == '\0') && (*(char *)(lVar19 + 0x8c) == '\0')) {
                *(long *)(lVar19 + 0x78) = lVar2;
                if (*(short *)(lVar2 + 0x40) < 0) {
                  iVar9 = *(int *)(lVar2 + 0x44);
                }
                else {
                  iVar9 = (int)*(short *)(lVar2 + 0x40) >> 5;
                }
                *(int *)(lVar19 + 0x80) = iVar9 - iVar17;
                if (*(char *)(lVar2 + 9) != '\0') {
                  uVar16 = (iVar9 - iVar17) + *(int *)(lVar2 + 0xc) + (int)*(char *)(lVar2 + 0x8c);
                  *(uint *)(lVar19 + 0xc) = uVar16;
                  uVar16 = uVar16 & 0xfffffff;
                  if (this->fPoolStringIndexLimit <= (int)uVar16) {
                    this->fPoolStringIndexLimit = uVar16 + 1;
                    sVar12 = *(short *)(lVar19 + 0x40);
                    iVar18 = *(int *)(lVar19 + 0x44);
                    iVar10 = (int)sVar12 >> 5;
                  }
                  *(undefined1 *)(lVar19 + 9) = 1;
                }
                if (sVar12 < 0) {
                  iVar10 = iVar18;
                }
                *(int *)(lVar2 + 0x88) =
                     *(int *)(lVar2 + 0x88) + (iVar10 + 1) * *(int *)(lVar19 + 0x84);
              }
              uVar20 = uVar20 + 1;
              if (uVar14 == uVar20) goto LAB_00215235;
            }
            iVar9 = (int)uVar20;
          }
        } while (iVar9 < (int)uVar8);
      }
LAB_00215235:
      uprv_sortArray_63(array,uVar8,8,compareStringLengths,(void *)0x0,'\0',errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (this->fIsPoolBundle == '\0') {
          if (this->fUsePoolBundle->fStringIndexLimit < this->fPoolStringIndexLimit) {
            __assert_fail("fPoolStringIndexLimit <= fUsePoolBundle->fStringIndexLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                          ,0x66a,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
          }
          if ((int)uVar8 < 1) {
            uVar20 = 0;
          }
          else {
            uVar20 = 0;
            do {
              pSVar3 = *(StringResource **)((long)array + uVar20 * 8);
              if (pSVar3->fSame != (StringResource *)0x0) goto LAB_00215482;
              if ((pSVar3->super_StringBaseResource).super_SResource.fWritten == '\0') {
                sVar12 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
                if (sVar12 < 0) {
                  iVar9 = (this->f16BitUnits).fUnion.fFields.fLength;
                }
                else {
                  iVar9 = (int)sVar12 >> 5;
                }
                if (this->fLocalStringIndexLimit <= iVar9) {
                  this->fLocalStringIndexLimit = iVar9 + 1;
                }
                StringResource::writeUTF16v2(pSVar3,this->fPoolStringIndexLimit,&this->f16BitUnits);
              }
              uVar20 = uVar20 + 1;
            } while (uVar8 != uVar20);
            uVar20 = (ulong)uVar8;
          }
LAB_00215482:
          if ((undefined1  [56])
              ((undefined1  [56])(this->f16BitUnits).fUnion & (undefined1  [56])0x1) !=
              (undefined1  [56])0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
            goto LAB_00215468;
          }
          pSVar4 = this->fWritePoolBundle;
          uVar21 = 0;
          if (2 >= gFormatVersion || pSVar4 == (SRBRoot *)0x0) {
            uVar21 = uVar20 & 0xffffffff;
          }
          if (0 < (int)uVar8 && (2 < gFormatVersion && pSVar4 != (SRBRoot *)0x0)) {
            pSVar5 = pSVar4->fRoot;
            uVar21 = 0;
            do {
              lVar2 = *(long *)((long)array + uVar21 * 8);
              if (*(long *)(lVar2 + 0x78) != 0) goto LAB_002154c6;
              if (*(ushort *)(lVar2 + 0x40) < 0x20) {
                __assert_fail("!array[i]->fString.isEmpty()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                              ,0x67f,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
              }
              this_00 = (StringBaseResource *)operator_new(0x90);
              StringBaseResource::StringBaseResource
                        (this_00,this->fWritePoolBundle,'\0',(UnicodeString *)(lVar2 + 0x38),
                         errorCode);
              (this_00->super_SResource)._vptr_SResource =
                   (_func_int **)&PTR__StringResource_004715f8;
              this_00[1].super_SResource._vptr_SResource = (_func_int **)0x0;
              this_00[1].super_SResource.fType = '\0';
              this_00[1].super_SResource.fWritten = '\0';
              *(undefined2 *)&this_00[1].super_SResource.field_0xa = 0;
              this_00[1].super_SResource.fRes = 0;
              *(undefined8 *)((long)&this_00[1].super_SResource.fRes + 1) = 0;
              (this_00->super_SResource).fNext = *(SResource **)&pSVar5[1].fType;
              *(StringBaseResource **)&pSVar5[1].fType = this_00;
              *(int *)&pSVar5[1]._vptr_SResource = *(int *)&pSVar5[1]._vptr_SResource + 1;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
          else {
LAB_002154c6:
            if ((int)uVar21 < (int)uVar8) {
              iVar9 = this->fPoolStringIndexLimit;
              iVar18 = this->fLocalStringIndexLimit;
              plVar15 = (long *)((long)array + (uVar21 & 0xffffffff) * 8);
              do {
                lVar2 = *plVar15;
                if (*(char *)(lVar2 + 9) == '\0') {
                  if (*(short *)(lVar2 + 0x40) < 0) {
                    iVar17 = *(int *)(lVar2 + 0x44);
                  }
                  else {
                    iVar17 = (int)*(short *)(lVar2 + 0x40) >> 5;
                  }
                  lVar19 = *(long *)(lVar2 + 0x78);
                  if (*(short *)(lVar19 + 0x40) < 0) {
                    iVar10 = *(int *)(lVar19 + 0x44);
                  }
                  else {
                    iVar10 = (int)*(short *)(lVar19 + 0x40) >> 5;
                  }
                  if (iVar17 == iVar10) {
                    __assert_fail("res->length() != same->length()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                                  ,0x690,
                                  "void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
                  }
                  uVar16 = (int)*(char *)(lVar19 + 0x8c) + *(int *)(lVar19 + 0xc) +
                           *(int *)(lVar2 + 0x80);
                  *(uint *)(lVar2 + 0xc) = uVar16;
                  iVar17 = (uVar16 & 0xfffffff) - iVar9;
                  if (iVar17 < 0) {
                    __assert_fail("localStringIndex >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                                  ,0x694,
                                  "void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
                  }
                  if (iVar18 <= iVar17) {
                    iVar18 = iVar17 + 1;
                    this->fLocalStringIndexLimit = iVar18;
                  }
                  *(undefined1 *)(lVar2 + 9) = 1;
                }
                plVar15 = plVar15 + 1;
                uVar16 = (int)uVar21 + 1;
                uVar21 = (ulong)uVar16;
              } while ((int)uVar16 < (int)uVar8);
            }
          }
        }
        else {
          if ((int)uVar8 < 1) {
            local_50 = 0;
            uVar16 = 0;
            uVar8 = 0;
          }
          else {
            uVar20 = 0;
            uVar8 = 0;
            uVar16 = 0;
            local_50 = 0;
            do {
              sVar12 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
              if (sVar12 < 0) {
                iVar9 = (this->f16BitUnits).fUnion.fFields.fLength;
              }
              else {
                iVar9 = (int)sVar12 >> 5;
              }
              pSVar3 = *(StringResource **)((long)array + uVar20 * 8);
              sVar12 = (pSVar3->super_StringBaseResource).fString.fUnion.fStackFields.
                       fLengthAndFlags;
              if (sVar12 < 0) {
                iVar13 = (pSVar3->super_StringBaseResource).fString.fUnion.fFields.fLength;
              }
              else {
                iVar13 = (int)sVar12 >> 5;
              }
              if ((pSVar3->fNumUnitsSaved < 10) ||
                 (0xfffffff < iVar9 + pSVar3->fNumCharsForLength + iVar13)) {
                local_50 = (ulong)(uint)((int)local_50 + pSVar3->fNumUnitsSaved);
                (pSVar3->super_StringBaseResource).super_SResource.fRes = 0;
                (pSVar3->super_StringBaseResource).super_SResource.fWritten = '\x01';
              }
              else {
                StringResource::writeUTF16v2(pSVar3,0,&this->f16BitUnits);
                uVar8 = uVar8 + 1;
                uVar16 = uVar16 + pSVar3->fNumUnitsSaved;
              }
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          if ((undefined1  [56])
              ((undefined1  [56])(this->f16BitUnits).fUnion & (undefined1  [56])0x1) !=
              (undefined1  [56])0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          UVar7 = getShowWarning();
          if (UVar7 != '\0') {
            printf("number of shared strings: %d\n",(ulong)uVar8);
            sVar12 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
            if (sVar12 < 0) {
              uVar8 = (this->f16BitUnits).fUnion.fFields.fLength;
            }
            else {
              uVar8 = (int)sVar12 >> 5;
            }
            printf("16-bit units for strings: %6d = %6d bytes\n",(ulong)uVar8,(ulong)(uVar8 * 2));
            printf("16-bit units saved:       %6d = %6d bytes\n",(ulong)uVar16,(ulong)(uVar16 * 2));
            printf("16-bit units not saved:   %6d = %6d bytes\n",local_50,
                   (ulong)(uint)((int)local_50 * 2));
          }
        }
        sVar12 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
        if (sVar12 < 0) {
          iVar9 = (this->f16BitUnits).fUnion.fFields.fLength;
        }
        else {
          iVar9 = (int)sVar12 >> 5;
        }
        if (this->f16BitStringsLength + 1 < iVar9) {
          __assert_fail("f16BitUnits.length() <= (f16BitStringsLength + 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                        ,0x69c,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
        }
      }
    }
  }
LAB_00215468:
  operator_delete__(array);
  return;
}

Assistant:

void
TableResource::handlePreWrite(uint32_t *byteOffset) {
    preWriteAllRes(byteOffset);
    if (fTableType == URES_TABLE) {
        /* 16-bit count, 16-bit key offsets, 32-bit values */
        fRes = URES_MAKE_RESOURCE(URES_TABLE, *byteOffset >> 2);
        *byteOffset += 2 + fCount * 6;
    } else {
        /* 32-bit count, key offsets and values */
        fRes = URES_MAKE_RESOURCE(URES_TABLE32, *byteOffset >> 2);
        *byteOffset += 4 + fCount * 8;
    }
}